

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneobject.cpp
# Opt level: O2

mat4 * __thiscall SceneObject::getLocalToWorld(mat4 *__return_storage_ptr__,SceneObject *this)

{
  glm::detail::tmat4x4<float>::tmat4x4(__return_storage_ptr__,&this->localToWorld);
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 SceneObject::getLocalToWorld() const {
    return localToWorld;
}